

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O3

try_update_result_type __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::try_insert(olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
             *this,art_key_type k,value_type v,olc_db_leaf_unique_ptr_type *cached_leaf)

{
  __extent_storage<18446744073709551615UL> *this_00;
  atomic<long> *paVar1;
  long *plVar2;
  long lVar3;
  basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
  bVar4;
  optimistic_lock *poVar5;
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
  *pbVar6;
  value_view v_00;
  value_view v_01;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k_00;
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> k_01;
  write_guard wVar7;
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *poVar8;
  undefined1 auVar9 [8];
  __extent_storage<18446744073709551615UL> this_01;
  bool bVar10;
  uint uVar11;
  int iVar12;
  uintptr_t result;
  _Storage<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true>
  _Var13;
  undefined8 uVar14;
  undefined8 uVar15;
  ushort uVar16;
  basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
  *this_02;
  __extent_storage<18446744073709551615UL> _Var17;
  pointer pbVar18;
  ushort uVar19;
  optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
  oVar20;
  undefined1 local_e8 [8];
  value_type v_local;
  art_key_type k_local;
  basic_node_ptr<unodb::detail::olc_node_header> node;
  _Storage<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true>
  local_b8;
  in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
  *node_in_parent;
  write_guard parent_guard_1;
  write_guard local_a0;
  uint shared_prefix_length;
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *local_90;
  undefined1 auStack_88 [8];
  art_key_type remaining_key;
  write_guard local_70;
  write_guard parent_guard;
  key_view existing_key;
  read_critical_section node_critical_section;
  undefined1 auStack_40 [4];
  tree_depth_type depth;
  read_critical_section parent_critical_section;
  
  v_local._M_ptr = (pointer)v._M_extent._M_extent_value;
  local_e8 = (undefined1  [8])v._M_ptr;
  k_local.field_0.key._M_ptr = (pointer)k.field_0._8_8_;
  v_local._M_extent._M_extent_value = k.field_0._0_8_;
  optimistic_lock::try_read_lock((optimistic_lock *)auStack_40);
  if (_auStack_40 == 0) {
    uVar19 = 0;
    uVar16 = 0;
  }
  else {
    _Var17._M_extent_value = (this->root).value._M_i.tagged_ptr;
    k_local.field_0.key._M_extent._M_extent_value =
         (__extent_storage<18446744073709551615UL>)_Var17._M_extent_value;
    _shared_prefix_length =
         (__uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          *)cached_leaf;
    local_90 = this;
    if (_Var17._M_extent_value == 0) {
      detail::
      create_leaf_if_needed<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                (cached_leaf,
                 (basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>)k.field_0,v,
                 this);
      bVar10 = optimistic_lock::try_upgrade_to_write_lock
                         ((optimistic_lock *)_auStack_40,(version_type)parent_critical_section.lock)
      ;
      uVar16 = 0;
      auStack_88 = (undefined1  [8])0;
      if (bVar10) {
        auStack_88 = (undefined1  [8])_auStack_40;
      }
      _auStack_40 = 0;
      if (auStack_88 != (undefined1  [8])0x0) {
        pbVar6 = (cached_leaf->_M_t).
                 super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 .
                 super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_false>
                 ._M_head_impl;
        (cached_leaf->_M_t).
        super___uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        .
        super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_false>
        ._M_head_impl =
             (basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
              *)0x0;
        if (((ulong)pbVar6 & 7) != 0) {
LAB_001b4245:
          __assert_fail("(result & ptr_bit_mask) == uintptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                        ,0x182,
                        "static std::uintptr_t unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>::tag_ptr(const Header *, unodb::node_type) [Header = unodb::detail::olc_node_header]"
                       );
        }
        (this->root).value._M_i.tagged_ptr = (uintptr_t)pbVar6;
        uVar16 = 0x100;
      }
      optimistic_lock::write_guard::~write_guard((write_guard *)auStack_88);
LAB_001b3ee5:
      uVar19 = 1;
    }
    else {
      node_critical_section.version.version._4_4_ = 0;
      auStack_88 = (undefined1  [8])v_local._M_extent._M_extent_value;
      remaining_key.field_0.key._M_ptr = k_local.field_0.key._M_ptr;
      local_b8 = (_Storage<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true>
                  )&this->root;
      bVar10 = optimistic_lock::check
                         ((optimistic_lock *)_auStack_40,(version_type)parent_critical_section.lock)
      ;
      if (bVar10) {
        optimistic_lock::try_read_lock((optimistic_lock *)&existing_key._M_extent);
        if (existing_key._M_extent._M_extent_value != 0) {
LAB_001b3b22:
          uVar15 = remaining_key.field_0.key._M_ptr;
          auVar9 = auStack_88;
          uVar14 = k_local.field_0.key._M_ptr;
          this_02 = (basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
                     *)(_Var17._M_extent_value & 0xfffffffffffffff8);
          if ((_Var17._M_extent_value & 7) == 0) {
            parent_guard.lock = (optimistic_lock *)(this_02 + 0x20);
            pbVar18 = (pointer)(ulong)*(uint *)(this_02 + 0x18);
            k_00.field_0.key._M_extent._M_extent_value =
                 (__extent_storage<18446744073709551615UL>)
                 (__extent_storage<18446744073709551615UL>)k_local.field_0.key._M_ptr;
            k_00.field_0.key._M_ptr = (pointer)v_local._M_extent._M_extent_value;
            uVar15 = k_local.field_0.key._M_ptr;
            if (pbVar18 < k_local.field_0.key._M_ptr) {
              uVar15 = pbVar18;
            }
            existing_key._M_ptr = pbVar18;
            iVar12 = bcmp((void *)v_local._M_extent._M_extent_value,parent_guard.lock,uVar15);
            poVar8 = local_90;
            if (((pointer)uVar14 != pbVar18) || (iVar12 != 0)) {
              v_01._M_extent._M_extent_value = (size_t)v_local._M_ptr;
              v_01._M_ptr = (pointer)local_e8;
              detail::
              create_leaf_if_needed<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                        ((olc_db_leaf_unique_ptr<std::span<const_std::byte>,_std::span<const_std::byte>_>
                          *)_shared_prefix_length,k_00,v_01,local_90);
              detail::
              basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
              ::
              make_db_inode_unique_ptr<unodb::detail::olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,std::span<std::byte_const,18446744073709551615ul>const&,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::tree_depth<unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>>&>
                        ((basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
                          *)&node_in_parent,poVar8,
                         (span<const_std::byte,_18446744073709551615UL> *)&parent_guard,
                         (basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)
                         auStack_88,
                         (tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
                          *)((long)&node_critical_section.version.version + 4));
              bVar10 = optimistic_lock::try_upgrade_to_write_lock
                                 ((optimistic_lock *)_auStack_40,
                                  (version_type)parent_critical_section.lock);
              local_70.lock = (optimistic_lock *)0x0;
              if (bVar10) {
                local_70.lock = (optimistic_lock *)_auStack_40;
              }
              _auStack_40 = 0;
              if (local_70.lock == (optimistic_lock *)0x0) {
LAB_001b416b:
                optimistic_lock::write_guard::~write_guard(&local_70);
                uVar16 = 0;
              }
              else {
                bVar10 = optimistic_lock::try_upgrade_to_write_lock
                                   ((optimistic_lock *)existing_key._M_extent._M_extent_value,
                                    (version_type)node_critical_section.lock);
                local_a0.lock = (optimistic_lock *)0x0;
                if (bVar10) {
                  local_a0.lock = (optimistic_lock *)existing_key._M_extent;
                }
                existing_key._M_extent._M_extent_value = 0;
                if (local_a0.lock == (optimistic_lock *)0x0) {
                  optimistic_lock::write_guard::~write_guard(&local_a0);
                  goto LAB_001b416b;
                }
                detail::
                olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                ::init((olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                        *)parent_guard_1.lock,(EVP_PKEY_CTX *)parent_guard.lock);
                wVar7 = parent_guard_1;
                parent_guard_1.lock = (optimistic_lock *)0x0;
                if (((ulong)wVar7.lock & 7) != 0) goto LAB_001b4245;
                ((local_b8._M_value)->value)._M_i.tagged_ptr = (ulong)wVar7.lock | 1;
                optimistic_lock::write_guard::~write_guard(&local_a0);
                optimistic_lock::write_guard::~write_guard(&local_70);
                LOCK();
                (local_90->growing_inode_counts)._M_elems[0].super___atomic_base<unsigned_long>._M_i
                     = (local_90->growing_inode_counts)._M_elems[0].
                       super___atomic_base<unsigned_long>._M_i + 1;
                UNLOCK();
                uVar16 = 0x100;
              }
              if (parent_guard_1.lock != (optimistic_lock *)0x0) {
                free(parent_guard_1.lock);
                olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                ::
                decrement_inode_count<unodb::detail::olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                          ((olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                            *)node_in_parent);
              }
              uVar19 = 1;
              goto LAB_001b402d;
            }
            if ((((atomic<long> *)(_auStack_40 + 8))->super___atomic_base<long>)._M_i < 1) {
LAB_001b41e0:
              __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                            ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
            }
            poVar5 = *(optimistic_lock **)_auStack_40;
            LOCK();
            paVar1 = (atomic<long> *)(_auStack_40 + 8);
            lVar3 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (parent_critical_section.lock == poVar5) {
              if (0 < lVar3) {
                _auStack_40 = 0;
                if (*(long *)(existing_key._M_extent._M_extent_value + 8) < 1) goto LAB_001b41e0;
                LOCK();
                plVar2 = (long *)(existing_key._M_extent._M_extent_value + 8);
                lVar3 = *plVar2;
                *plVar2 = *plVar2 + -1;
                UNLOCK();
                if (node_critical_section.lock !=
                    *(optimistic_lock **)existing_key._M_extent._M_extent_value) {
                  if (lVar3 < 1) goto LAB_001b41ff;
                  existing_key._M_extent._M_extent_value = 0;
                  goto LAB_001b3cc5;
                }
                if (0 < lVar3) {
                  existing_key._M_extent._M_extent_value = 0;
                  uVar16 = 0x100;
                  if ((_shared_prefix_length->_M_t).
                      super__Tuple_impl<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                      .
                      super__Head_base<0UL,_unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>_*,_false>
                      ._M_head_impl ==
                      (basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
                       *)0x0) {
                    uVar19 = 0;
                  }
                  else {
                    uVar19 = 0;
                    std::
                    __uniq_ptr_impl<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                    ::reset(_shared_prefix_length,(pointer)0x0);
                  }
                  goto LAB_001b402d;
                }
              }
            }
            else if (0 < lVar3) {
              _auStack_40 = 0;
              goto LAB_001b3cc5;
            }
          }
          else {
            bVar4 = this_02[0x1f];
            if (7 < (byte)bVar4) {
              __assert_fail("result <= key_prefix_capacity",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                            ,0x298,
                            "key_prefix_size unodb::detail::key_prefix<unodb::detail::basic_art_key<std::span<const std::byte>>, unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::critical_section_policy>::length() const [ArtKey = unodb::detail::basic_art_key<std::span<const std::byte>>, CriticalSectionPolicy = unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const std::byte>, std::span<const std::byte>, unodb::olc_db, unodb::in_critical_section, unodb::optimistic_lock, unodb::optimistic_lock::read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>, unodb::detail::olc_inode_defs, unodb::detail::db_inode_qsbr_deleter, unodb::detail::db_leaf_qsbr_deleter>>::critical_section_policy]"
                           );
            }
            pbVar18 = (pointer)(ulong)(byte)bVar4;
            parent_guard.lock = (optimistic_lock *)0x0;
            uVar14 = (pointer)0x8;
            if (remaining_key.field_0.key._M_ptr < (pointer)0x8) {
              uVar14 = remaining_key.field_0.key._M_ptr;
            }
            memcpy(&parent_guard,(void *)auStack_88,uVar14);
            uVar11 = detail::
                     key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                     ::get_shared_length((key_prefix<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_inode_impl<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>::critical_section_policy>
                                          *)(this_02 + 0x18),(uint64_t)parent_guard.lock);
            poVar8 = local_90;
            local_a0.lock._0_4_ = uVar11;
            if (uVar11 < (byte)bVar4) {
              k_01.field_0.key._M_extent._M_extent_value =
                   (__extent_storage<18446744073709551615UL>)
                   (__extent_storage<18446744073709551615UL>)k_local.field_0.key._M_ptr;
              k_01.field_0.key._M_ptr = (pointer)v_local._M_extent._M_extent_value;
              v_00._M_extent._M_extent_value = (size_t)v_local._M_ptr;
              v_00._M_ptr = (pointer)local_e8;
              detail::
              create_leaf_if_needed<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                        ((olc_db_leaf_unique_ptr<std::span<const_std::byte>,_std::span<const_std::byte>_>
                          *)_shared_prefix_length,k_01,v_00,local_90);
              detail::
              basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
              ::
              make_db_inode_unique_ptr<unodb::detail::olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>&,unsigned_int_const&>
                        ((basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>
                          *)&parent_guard,poVar8,
                         (basic_node_ptr<unodb::detail::olc_node_header> *)
                         &k_local.field_0.key._M_extent,(uint *)&local_a0);
              bVar10 = optimistic_lock::try_upgrade_to_write_lock
                                 ((optimistic_lock *)_auStack_40,
                                  (version_type)parent_critical_section.lock);
              node_in_parent =
                   (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                    *)(optimistic_lock *)0x0;
              if (bVar10) {
                node_in_parent =
                     (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                      *)_auStack_40;
              }
              _auStack_40 = 0;
              if ((optimistic_lock *)node_in_parent == (optimistic_lock *)0x0) {
LAB_001b4134:
                optimistic_lock::write_guard::~write_guard((write_guard *)&node_in_parent);
                uVar16 = 0;
              }
              else {
                bVar10 = optimistic_lock::try_upgrade_to_write_lock
                                   ((optimistic_lock *)existing_key._M_extent._M_extent_value,
                                    (version_type)node_critical_section.lock);
                local_70.lock = (optimistic_lock *)0x0;
                if (bVar10) {
                  local_70.lock = (optimistic_lock *)existing_key._M_extent;
                }
                existing_key._M_extent._M_extent_value = 0;
                if (local_70.lock == (optimistic_lock *)0x0) {
                  optimistic_lock::write_guard::~write_guard(&local_70);
                  goto LAB_001b4134;
                }
                detail::
                olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                ::init((olc_inode_4<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                        *)existing_key._M_ptr,
                       (EVP_PKEY_CTX *)k_local.field_0.key._M_extent._M_extent_value);
                pbVar18 = existing_key._M_ptr;
                existing_key._M_ptr = (pointer)0x0;
                if (((ulong)pbVar18 & 7) != 0) goto LAB_001b4245;
                ((local_b8._M_value)->value)._M_i.tagged_ptr = (ulong)pbVar18 | 1;
                optimistic_lock::write_guard::~write_guard(&local_70);
                optimistic_lock::write_guard::~write_guard((write_guard *)&node_in_parent);
                LOCK();
                (poVar8->growing_inode_counts)._M_elems[0].super___atomic_base<unsigned_long>._M_i =
                     (poVar8->growing_inode_counts)._M_elems[0].super___atomic_base<unsigned_long>.
                     _M_i + 1;
                UNLOCK();
                LOCK();
                (poVar8->key_prefix_splits).super___atomic_base<unsigned_long>._M_i =
                     (poVar8->key_prefix_splits).super___atomic_base<unsigned_long>._M_i + 1;
                UNLOCK();
                uVar16 = 0x100;
              }
              if (existing_key._M_ptr != (pointer)0x0) {
                free(existing_key._M_ptr);
                olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                ::
                decrement_inode_count<unodb::detail::olc_inode_4<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                          ((olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
                            *)parent_guard.lock);
              }
LAB_001b3edc:
              optimistic_lock::read_critical_section::~read_critical_section
                        ((read_critical_section *)&existing_key._M_extent);
              goto LAB_001b3ee5;
            }
            if (uVar11 != (byte)bVar4) {
              __assert_fail("shared_prefix_length == key_prefix_length",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                            ,0x76f,
                            "typename olc_db<Key, Value>::try_update_result_type unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::try_insert(art_key_type, value_type, olc_db_leaf_unique_ptr_type &) [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                           );
            }
            node_critical_section.version.version._4_4_ =
                 node_critical_section.version.version._4_4_ + uVar11;
            if ((ulong)uVar15 < pbVar18) {
LAB_001b421e:
              __assert_fail("num_bytes <= key.size_bytes()",
                            "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                            ,0xc0,
                            "void unodb::detail::basic_art_key<std::span<const std::byte>>::shift_right(const std::size_t) [KeyType = std::span<const std::byte>]"
                           );
            }
            auStack_88 = (undefined1  [8])((long)auVar9 + (long)pbVar18);
            parent_guard.lock._0_1_ = *(pointer)((long)auVar9 + (long)pbVar18);
            this_00 = &existing_key._M_extent;
            remaining_key.field_0.key._M_ptr = (pointer)(uVar15 + -(long)pbVar18);
            oVar20 = detail::
                     basic_inode_impl<unodb::detail::basic_art_policy<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>,unodb::olc_db,unodb::in_critical_section,unodb::optimistic_lock,unodb::optimistic_lock::read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,unodb::detail::olc_inode_defs,unodb::detail::db_inode_qsbr_deleter,unodb::detail::db_leaf_qsbr_deleter>>
                     ::
                     add_or_choose_subtree<std::optional<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*>,std::byte,unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>&,std::span<std::byte_const,18446744073709551615ul>&,unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>&,unodb::detail::tree_depth<unodb::detail::basic_art_key<std::span<std::byte_const,18446744073709551615ul>>>&,unodb::optimistic_lock::read_critical_section&,unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>>*&,unodb::optimistic_lock::read_critical_section&,std::unique_ptr<unodb::detail::basic_leaf<std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_node_header>,unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>>&>
                               (this_02,(node_type)_Var17._M_extent_value & (I256|I48),
                                (byte *)&parent_guard,
                                (basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>
                                 *)&v_local._M_extent,
                                (span<const_std::byte,_18446744073709551615UL> *)local_e8,local_90,
                                (tree_depth<unodb::detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_>
                                 *)((long)&node_critical_section.version.version + 4),
                                (read_critical_section *)this_00,&local_b8._M_value,
                                (read_critical_section *)auStack_40,
                                (unique_ptr<unodb::detail::basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                                 *)_shared_prefix_length);
            this_01 = existing_key._M_extent;
            _Var13 = oVar20.
                     super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
                     ._M_payload;
            if (((undefined1  [16])
                 oVar20.
                 super__Optional_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<unodb::in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>_*>
                & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_001b4074:
              uVar16 = 0;
              goto LAB_001b3edc;
            }
            if (_Var13._M_value ==
                (in_critical_section<unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>_>
                 *)0x0) {
              uVar16 = 0x100;
              goto LAB_001b3edc;
            }
            if ((((atomic<long> *)(_auStack_40 + 8))->super___atomic_base<long>)._M_i < 1)
            goto LAB_001b41e0;
            poVar5 = *(optimistic_lock **)_auStack_40;
            LOCK();
            paVar1 = (atomic<long> *)(_auStack_40 + 8);
            lVar3 = (paVar1->super___atomic_base<long>)._M_i;
            (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1
            ;
            UNLOCK();
            if (parent_critical_section.lock != poVar5) {
              if (lVar3 < 1) goto LAB_001b41ff;
              _auStack_40 = 0;
              goto LAB_001b4074;
            }
            if (0 < lVar3) {
              _Var17._M_extent_value = ((_Var13._M_value)->value)._M_i.tagged_ptr;
              _auStack_40 = existing_key._M_extent._M_extent_value;
              existing_key._M_extent._M_extent_value = 0;
              parent_critical_section.lock = node_critical_section.lock;
              node_critical_section.version.version._4_4_ =
                   node_critical_section.version.version._4_4_ + 1;
              k_local.field_0.key._M_extent._M_extent_value =
                   (__extent_storage<18446744073709551615UL>)_Var17._M_extent_value;
              local_b8 = _Var13;
              if (remaining_key.field_0.key._M_ptr == (pointer)0x0) goto LAB_001b421e;
              remaining_key.field_0.key._M_ptr = remaining_key.field_0.key._M_ptr + -1;
              auStack_88 = (undefined1  [8])((long)auStack_88 + 1);
              bVar10 = optimistic_lock::check
                                 ((optimistic_lock *)this_01._M_extent_value,
                                  (version_type)node_critical_section.lock);
              if (!bVar10) {
                _auStack_40 = 0;
                optimistic_lock::read_critical_section::~read_critical_section
                          ((read_critical_section *)&existing_key._M_extent);
                goto LAB_001b408c;
              }
              optimistic_lock::read_critical_section::~read_critical_section
                        ((read_critical_section *)this_00);
              optimistic_lock::try_read_lock((optimistic_lock *)this_00);
              if (existing_key._M_extent._M_extent_value == 0) goto LAB_001b3cc5;
              goto LAB_001b3b22;
            }
          }
LAB_001b41ff:
          __assert_fail("old_value > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                        ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
        }
LAB_001b3cc5:
        uVar19 = 0;
        uVar16 = 0;
LAB_001b402d:
        optimistic_lock::read_critical_section::~read_critical_section
                  ((read_critical_section *)&existing_key._M_extent);
      }
      else {
        _auStack_40 = 0;
LAB_001b408c:
        uVar19 = 0;
        uVar16 = 0;
      }
    }
  }
  optimistic_lock::read_critical_section::~read_critical_section
            ((read_critical_section *)auStack_40);
  return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)(uVar16 | uVar19);
}

Assistant:

typename olc_db<Key, Value>::try_update_result_type
olc_db<Key, Value>::try_insert(art_key_type k, value_type v,
                               olc_db_leaf_unique_ptr_type& cached_leaf) {
  auto parent_critical_section = root_pointer_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(parent_critical_section.must_restart())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  auto node{root.load()};

  if (UNODB_DETAIL_UNLIKELY(node == nullptr)) {
    create_leaf_if_needed(cached_leaf, k, v, *this);

    const optimistic_lock::write_guard write_unlock_on_exit{
        std::move(parent_critical_section)};
    if (UNODB_DETAIL_UNLIKELY(write_unlock_on_exit.must_restart())) {
      // Do not call spin_wait_loop_body here - creating the leaf took some time
      return {};  // LCOV_EXCL_LINE
    }

    root = detail::olc_node_ptr{cached_leaf.release(), node_type::LEAF};
    return true;
  }

  auto* node_in_parent{&root};
  tree_depth_type depth{};
  auto remaining_key{k};

  if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) {
    // LCOV_EXCL_START
    spin_wait_loop_body();
    return {};
    // LCOV_EXCL_STOP
  }

  while (true) {
    auto node_critical_section = node_ptr_lock(node).try_read_lock();
    if (UNODB_DETAIL_UNLIKELY(node_critical_section.must_restart())) return {};

    const auto node_type = node.type();

    if (node_type == node_type::LEAF) {
      const auto* const leaf{node.template ptr<leaf_type*>()};
      const auto existing_key{leaf->get_key_view()};
      if (UNODB_DETAIL_UNLIKELY(k.cmp(existing_key) == 0)) {
        if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
          return {};  // LCOV_EXCL_LINE
        if (UNODB_DETAIL_UNLIKELY(!node_critical_section.try_read_unlock()))
          return {};  // LCOV_EXCL_LINE

        if (UNODB_DETAIL_UNLIKELY(cached_leaf != nullptr)) {
          cached_leaf.reset();  // LCOV_EXCL_LINE
        }
        return false;  // exists
      }

      create_leaf_if_needed(cached_leaf, k, v, *this);
      auto new_node{inode_4::create(*this, existing_key, remaining_key, depth)};

      {
        const optimistic_lock::write_guard parent_guard{
            std::move(parent_critical_section)};
        if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

        const optimistic_lock::write_guard node_guard{
            std::move(node_critical_section)};
        if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

        new_node->init(existing_key, remaining_key, depth, leaf,
                       std::move(cached_leaf));
        *node_in_parent =
            detail::olc_node_ptr{new_node.release(), node_type::I4};
      }
#ifdef UNODB_DETAIL_WITH_STATS
      account_growing_inode<node_type::I4>();
#endif  // UNODB_DETAIL_WITH_STATS
      return true;
    }

    UNODB_DETAIL_ASSERT(node_type != node_type::LEAF);

    auto* const inode{node.template ptr<inode_type*>()};
    const auto& key_prefix{inode->get_key_prefix()};
    const auto key_prefix_length{key_prefix.length()};
    const auto shared_prefix_length{
        key_prefix.get_shared_length(remaining_key)};

    if (shared_prefix_length < key_prefix_length) {
      create_leaf_if_needed(cached_leaf, k, v, *this);
      auto new_node{inode_4::create(*this, node, shared_prefix_length)};

      {
        const optimistic_lock::write_guard parent_guard{
            std::move(parent_critical_section)};
        if (UNODB_DETAIL_UNLIKELY(parent_guard.must_restart())) return {};

        const optimistic_lock::write_guard node_guard{
            std::move(node_critical_section)};
        if (UNODB_DETAIL_UNLIKELY(node_guard.must_restart())) return {};

        new_node->init(node, shared_prefix_length, depth,
                       std::move(cached_leaf));
        *node_in_parent =
            detail::olc_node_ptr{new_node.release(), node_type::I4};
      }

#ifdef UNODB_DETAIL_WITH_STATS
      account_growing_inode<node_type::I4>();
      key_prefix_splits.fetch_add(1, std::memory_order_relaxed);
#endif  // UNODB_DETAIL_WITH_STATS

      return true;
    }

    UNODB_DETAIL_ASSERT(shared_prefix_length == key_prefix_length);

    depth += key_prefix_length;
    remaining_key.shift_right(key_prefix_length);

    const auto add_result{inode->template add_or_choose_subtree<
        std::optional<in_critical_section<detail::olc_node_ptr>*>>(
        node_type, remaining_key[0], k, v, *this, depth, node_critical_section,
        node_in_parent, parent_critical_section, cached_leaf)};

    if (UNODB_DETAIL_UNLIKELY(!add_result)) return {};

    auto* const child_in_parent = *add_result;
    if (child_in_parent == nullptr) return true;

    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.try_read_unlock()))
      return {};  // LCOV_EXCL_LINE

    const auto child = child_in_parent->load();

    parent_critical_section = std::move(node_critical_section);
    node = child;
    node_in_parent = child_in_parent;
    ++depth;
    remaining_key.shift_right(1);

    if (UNODB_DETAIL_UNLIKELY(!parent_critical_section.check())) return {};
  }
}